

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall soul::heart::Parser::parseStateVariable(Parser *this)

{
  pool_ptr<soul::Module> *this_00;
  ProgramImpl *pPVar1;
  bool bVar2;
  Module *pMVar3;
  Variable *v;
  AggregateInitialiserList *pAVar4;
  Identifier *args;
  string_view sVar5;
  Identifier name;
  FunctionParseState parseState;
  Type type;
  Identifier local_80;
  undefined1 local_78 [32];
  Ptr PStack_58;
  UTF8Reader local_50;
  pointer ppStack_48;
  BlockCode *local_40;
  Type local_38;
  
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"external");
  readValueType(&local_38,this);
  pPVar1 = (this->program).pimpl;
  readVariableIdentifier_abi_cxx11_((string *)local_78,this);
  local_80 = Allocator::get<std::__cxx11::string>
                       (&pPVar1->allocator,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_78);
  std::__cxx11::string::~string((string *)local_78);
  this_00 = &this->module;
  pMVar3 = pool_ptr<soul::Module>::operator->(this_00);
  sVar5 = Identifier::operator_cast_to_basic_string_view(&local_80);
  sVar5._M_str = (char *)sVar5._M_len;
  sVar5._M_len = (size_t)&pMVar3->stateVariables;
  Module::StateVariables::find((StateVariables *)local_78,sVar5);
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    Errors::nameInUse<soul::Identifier&>((CompileMessage *)local_78,(Errors *)&local_80,args);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,local_78);
    CompileMessage::~CompileMessage((CompileMessage *)local_78);
  }
  pMVar3 = pool_ptr<soul::Module>::operator->(this_00);
  local_78._0_4_ = (uint)bVar2 << 2;
  v = Module::
      allocate<soul::heart::Variable,soul::CodeLocation&,soul::Type&,soul::Identifier&,soul::heart::Variable::Role>
                (pMVar3,&(this->
                         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ).location,&local_38,&local_80,(Role *)local_78);
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x2a3521);
  if (bVar2) {
    pMVar3 = pool_ptr<soul::Module>::operator->(this_00);
    local_78._0_8_ = Module::allocate<soul::heart::Function>(pMVar3);
    local_78._8_8_ = (pointer)0x0;
    local_78._16_8_ = 0;
    local_78._24_8_ = 0;
    PStack_58.object = (SourceCodeText *)0x0;
    local_50.data = (char *)0x0;
    ppStack_48 = (pointer)0x0;
    local_40 = (BlockCode *)0x0;
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matches(&this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ,(TokenType)0x2c8be9);
    if (bVar2) {
      pAVar4 = parseInitialiserList(this,(FunctionParseState *)local_78,&local_38);
    }
    else {
      pAVar4 = (AggregateInitialiserList *)parseExpression(this,(FunctionParseState *)local_78);
    }
    (v->initialValue).object = &pAVar4->super_Expression;
    FunctionParseState::~FunctionParseState((FunctionParseState *)local_78);
  }
  parseAnnotation(this,&v->annotation);
  pMVar3 = pool_ptr<soul::Module>::operator->(this_00);
  Module::StateVariables::add(&pMVar3->stateVariables,v);
  expectSemicolon(this);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_38.structure);
  return;
}

Assistant:

void parseStateVariable()
    {
        bool isExternal = matchIf ("external");
        auto type = readValueType();
        auto name = program.getAllocator().get (readVariableIdentifier());

        if (module->stateVariables.find (name))
            throwError (Errors::nameInUse (name));

        auto& v = module->allocate<heart::Variable> (location, type, name,
                                                     isExternal ? heart::Variable::Role::external
                                                                : heart::Variable::Role::state);

        if (matchIf (HEARTOperator::assign))
        {
            FunctionParseState parseState (module->allocate<heart::Function>());

            if (matches (HEARTOperator::openParen))
                v.initialValue = parseInitialiserList (parseState, type);
            else
                v.initialValue = parseExpression (parseState);
        }

        parseAnnotation (v.annotation);

        module->stateVariables.add (v);
        expectSemicolon();
    }